

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O3

void __thiscall
sisl::cartesian_cubic<short>::each_site
          (cartesian_cubic<short> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  uint *puVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  undefined8 *puVar2;
  uint uVar3;
  bool bVar4;
  lattice_site site;
  uint local_70;
  uint local_6c;
  Matrix<int,__1,_1,_0,__1,_1> local_68;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_50;
  
  uVar3 = 0;
  do {
    local_6c = 0;
    do {
      local_70 = 0;
      do {
        local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (int *)0x0;
        local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
        puVar1 = (uint *)malloc(0xc);
        if (puVar1 == (uint *)0x0) {
          puVar2 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar2 = operator_delete;
          __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
        local_50.m_row = 0;
        local_50.m_col = 1;
        local_50.m_currentBlockRows = 1;
        *puVar1 = uVar3;
        local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (int *)puVar1;
        local_50.m_xpr = &local_68;
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_50,(Scalar *)&local_6c);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                  (this_00,(Scalar *)&local_70);
        if ((local_50.m_currentBlockRows + local_50.m_row !=
             ((local_50.m_xpr)->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) || (local_50.m_col != 1)) {
LAB_0014acfe:
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<int, -1, 1>>::finished() [MatrixType = Eigen::Matrix<int, -1, 1>]"
                       );
        }
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          goto LAB_0014acfe;
        }
        (*func->_M_invoker)((_Any_data *)func,&local_68);
        free(local_68.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        local_70 = local_70 + 1;
      } while (local_70 <= this->_nz);
      local_6c = local_6c + 1;
    } while (local_6c <= this->_ny);
    bVar4 = this->_nx <= uVar3;
    uVar3 = uVar3 + 1;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i++) {
                for(int j = 0; j <= _ny; j++) {
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site site(3);
                        site << i, j, k;
                        func(site);
                    }
                }
            }
        }